

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

Geometry * rw::Geometry::create(int32 numVerts,int32 numTris,uint32 flags)

{
  FILE *__stream;
  char *pcVar1;
  EVP_PKEY_CTX *ctx;
  undefined4 local_54;
  int local_48;
  int local_44;
  int32 i_2;
  int32 i_1;
  uint8 *data;
  int32 sz;
  int32 i;
  Error _e;
  Geometry *geo;
  uint32 flags_local;
  int32 numTris_local;
  int32 numVerts_local;
  
  _e = (Error)malloc_LOC((long)(int)s_plglist,0x3000f,
                         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 30"
                        );
  if (_e == (Error)0x0) {
    sz = 0xf;
    i = -0x7ffffffe;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp",0x20);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000002,(ulong)s_plglist);
    fprintf(__stream,"%s\n",pcVar1);
    setError((Error *)&sz);
    numTris_local = 0;
    numVerts_local = 0;
  }
  else {
    numAllocated = numAllocated + 1;
    Object::init((Object *)_e,(EVP_PKEY_CTX *)0x8);
    *(uint32 *)((long)_e + 0x10) = flags & 0xff00ffff;
    *(uint32 *)((long)_e + 0x24) = (flags & 0xff0000) >> 0x10;
    if (*(int *)((long)_e + 0x24) == 0) {
      if ((*(uint *)((long)_e + 0x10) & 4) == 0) {
        local_54 = 0;
        if ((*(uint *)((long)_e + 0x10) & 0x80) != 0) {
          local_54 = 2;
        }
      }
      else {
        local_54 = 1;
      }
      *(undefined4 *)((long)_e + 0x24) = local_54;
    }
    *(int32 *)((long)_e + 0x18) = numTris;
    *(int32 *)((long)_e + 0x1c) = numVerts;
    *(undefined8 *)((long)_e + 0x30) = 0;
    for (data._4_4_ = 0; data._4_4_ < 8; data._4_4_ = data._4_4_ + 1) {
      *(undefined8 *)((long)_e + 0x38 + (long)data._4_4_ * 8) = 0;
    }
    *(undefined8 *)((long)_e + 0x28) = 0;
    if ((*(uint *)((long)_e + 0x10) & 0x1000000) == 0) {
      data._0_4_ = *(int *)((long)_e + 0x18) * 8;
      if ((*(uint *)((long)_e + 0x10) & 8) != 0) {
        data._0_4_ = (int)data + *(int *)((long)_e + 0x1c) * 4;
      }
      _i_2 = mustmalloc_LOC((long)((int)data +
                                  *(int *)((long)_e + 0x24) * *(int *)((long)_e + 0x1c) * 8),0x3000f
                            ,
                            "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 58"
                           );
      *(void **)((long)_e + 0x28) = _i_2;
      _i_2 = (void *)((long)*(int *)((long)_e + 0x18) * 8 + (long)_i_2);
      if (((*(uint *)((long)_e + 0x10) & 8) != 0) && (*(int *)((long)_e + 0x1c) != 0)) {
        *(void **)((long)_e + 0x30) = _i_2;
        _i_2 = (void *)((long)*(int *)((long)_e + 0x1c) * 4 + (long)_i_2);
      }
      if (*(int *)((long)_e + 0x1c) != 0) {
        for (local_44 = 0; local_44 < *(int *)((long)_e + 0x24); local_44 = local_44 + 1) {
          *(void **)((long)_e + 0x38 + (long)local_44 * 8) = _i_2;
          _i_2 = (void *)((long)*(int *)((long)_e + 0x1c) * 8 + (long)_i_2);
        }
      }
      for (local_48 = 0; local_48 < *(int *)((long)_e + 0x18); local_48 = local_48 + 1) {
        *(undefined2 *)(*(long *)((long)_e + 0x28) + 6 + (long)local_48 * 8) = 0xffff;
      }
    }
    *(undefined4 *)((long)_e + 0x20) = 0;
    *(undefined8 *)((long)_e + 0x78) = 0;
    ctx = (EVP_PKEY_CTX *)0x1;
    addMorphTargets((Geometry *)_e,1);
    MaterialList::init((MaterialList *)((long)_e + 0x80),ctx);
    *(undefined2 *)((long)_e + 0x14) = 0;
    *(undefined8 *)((long)_e + 0x90) = 0;
    *(undefined8 *)((long)_e + 0x98) = 0;
    *(undefined4 *)((long)_e + 0xa0) = 1;
    PluginList::construct((PluginList *)&s_plglist,(void *)_e);
    _numTris_local = _e;
  }
  return (Geometry *)_numTris_local;
}

Assistant:

Geometry*
Geometry::create(int32 numVerts, int32 numTris, uint32 flags)
{
	Geometry *geo = (Geometry*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_GEOMETRY);
	if(geo == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	geo->object.init(Geometry::ID, 0);
	geo->flags = flags & 0xFF00FFFF;
	geo->numTexCoordSets = (flags & 0xFF0000) >> 16;
	if(geo->numTexCoordSets == 0)
		geo->numTexCoordSets = (geo->flags & TEXTURED)  ? 1 :
		                       (geo->flags & TEXTURED2) ? 2 : 0;
	geo->numTriangles = numTris;
	geo->numVertices = numVerts;

	geo->colors = nil;
	for(int32 i = 0; i < 8; i++)
		geo->texCoords[i] = nil;
	geo->triangles = nil;
	// Allocate all attributes at once. The triangle pointer
	// will hold the first address (even when there are no triangles)
	// so we can free easily.
	if(!(geo->flags & NATIVE)){
		int32 sz = geo->numTriangles*sizeof(Triangle);
		if(geo->flags & PRELIT)
			sz += geo->numVertices*sizeof(RGBA);
		sz += geo->numTexCoordSets*geo->numVertices*sizeof(TexCoords);

		uint8 *data = (uint8*)rwNew(sz, MEMDUR_EVENT | ID_GEOMETRY);
		geo->triangles = (Triangle*)data;
		data += geo->numTriangles*sizeof(Triangle);
		if(geo->flags & PRELIT && geo->numVertices){
			geo->colors = (RGBA*)data;
			data += geo->numVertices*sizeof(RGBA);
		}
		if(geo->numVertices)
			for(int32 i = 0; i < geo->numTexCoordSets; i++){
				geo->texCoords[i] = (TexCoords*)data;
				data += geo->numVertices*sizeof(TexCoords);
			}

		// init triangles
		for(int32 i = 0; i < geo->numTriangles; i++)
			geo->triangles[i].matId = 0xFFFF;
	}
	geo->numMorphTargets = 0;
	geo->morphTargets = nil;
	geo->addMorphTargets(1);

	geo->matList.init();
	geo->lockedSinceInst = 0;
	geo->meshHeader = nil;
	geo->instData = nil;
	geo->refCount = 1;

	s_plglist.construct(geo);
	return geo;
}